

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O2

Token * __thiscall Vault::Client::getToken_abi_cxx11_(Token *__return_storage_ptr__,Client *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->token_);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] virtual Token getToken() const { return token_; }